

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

void __thiscall helics::Input::getValue_impl<double>(void *param_1,double *param_2)

{
  bool bVar1;
  defV val_1;
  defV val;
  data_view dv;
  double *in_stack_000000d0;
  DataType DStack00000000000000dc;
  undefined8 in_stack_000000d8;
  data_view *in_stack_000000e0;
  Input *in_stack_00000260;
  double *in_stack_ffffffffffffff18;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff30;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff38;
  data_view *in_stack_ffffffffffffff40;
  defV *in_stack_ffffffffffffff50;
  shared_ptr<units::precise_unit> local_78;
  double *in_stack_ffffffffffffff98;
  defV *in_stack_ffffffffffffffa0;
  
  DStack00000000000000dc = (DataType)((ulong)in_stack_000000d8 >> 0x20);
  checkAndGetFedUpdate((Input *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  bVar1 = data_view::empty((data_view *)0x2ec0fe);
  if (bVar1) {
    valueExtract<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == -1) {
      loadSourceInformation(in_stack_00000260);
    }
    if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == 1) {
      in_stack_ffffffffffffff40 =
           (data_view *)
           doubleExtractAndConvert
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
      ;
      in_stack_ffffffffffffff38 = &local_78;
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::variant<double,void,void,double,void>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      valueExtract<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x2ec1b0);
    }
    else if (*(int *)((long)&(((data_view *)((long)param_1 + 0x40))->ref).
                             super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 4) == 2) {
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)0x2ec1f2);
      integerExtractAndConvert
                (in_stack_ffffffffffffff50,(data_view *)param_1,
                 (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      valueExtract<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x2ec23a);
    }
    else {
      valueExtract<double>(in_stack_000000e0,DStack00000000000000dc,in_stack_000000d0);
    }
    if (((ulong)(((data_view *)((long)param_1 + 0x40))->ref).
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi & 1) == 0) {
      make_valid<double&>(param_2);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38);
    }
    else {
      bVar1 = changeDetected((defV *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                             (double)in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
      if (bVar1) {
        make_valid<double&>(param_2);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)in_stack_ffffffffffffff40,(double *)in_stack_ffffffffffffff38);
      }
      else {
        valueExtract<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
  }
  *(undefined1 *)
   ((long)&(((data_view *)((long)param_1 + 0x40))->ref).
           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 1) = 0;
  data_view::~data_view((data_view *)0x2ec35e);
  return;
}

Assistant:

void Input::getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out)
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (injectionType == helics::DataType::HELICS_DOUBLE) {
            defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else if (injectionType == helics::DataType::HELICS_INT) {
            defV val;
            integerExtractAndConvert(val, dv, inputUnits, outputUnits);
            valueExtract(val, out);
        } else {
            valueExtract(dv, injectionType, out);
        }
        if (changeDetectionEnabled) {
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(out);
            } else {
                valueExtract(lastValue, out);
            }
        } else {
            lastValue = make_valid(out);
        }
    } else {
        valueExtract(lastValue, out);
    }
    hasUpdate = false;
}